

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# water.cpp
# Opt level: O0

shared_ptr<Image> runRippleStage(Image *previous,WaterEffectOptions *options)

{
  element_type *this;
  long in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  element_type *in_RDI;
  shared_ptr<Image> sVar2;
  shared_ptr<Image> *img_rippled;
  string *in_stack_ffffffffffffff68;
  element_type *__lhs;
  uint *in_stack_ffffffffffffff90;
  uint *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  float in_stack_ffffffffffffffc4;
  Image *in_stack_ffffffffffffffc8;
  Image *in_stack_ffffffffffffffd0;
  
  __lhs = in_RDI;
  std::make_shared<Image,unsigned_int_const&,unsigned_int_const&>
            (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  std::__shared_ptr<Image,_(__gnu_cxx::_Lock_policy)2>::get
            ((__shared_ptr<Image,_(__gnu_cxx::_Lock_policy)2> *)in_RDI);
  applyRipple(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4);
  _Var1._M_pi = extraout_RDX;
  if ((*(byte *)(in_RDX + 0x30) & 1) != 0) {
    this = std::__shared_ptr_access<Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Image,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x11fea8);
    std::operator+(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                   (char *)this);
    Image::toPNG(this,in_stack_ffffffffffffff68);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff90);
    _Var1._M_pi = extraout_RDX_00;
  }
  sVar2.super___shared_ptr<Image,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var1._M_pi;
  sVar2.super___shared_ptr<Image,_(__gnu_cxx::_Lock_policy)2>._M_ptr = __lhs;
  return (shared_ptr<Image>)sVar2.super___shared_ptr<Image,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Image> runRippleStage(const Image *previous, const WaterEffectOptions *options) {
  // Create a new image to store the result
  auto img_rippled = std::make_shared<Image>(previous->width, previous->height);

  // Apply the ripple effect
  applyRipple(previous, img_rippled.get(), options->ripple_frequency);

  // Save the resulting image
  if (options->save_intermediate)
    img_rippled->toPNG("output/" + options->img_name + "_rippled.png");

  return img_rippled;
}